

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O1

Promise<void> __thiscall
capnp::_::TestMoreStuffImpl::hold(TestMoreStuffImpl *this,HoldContext context)

{
  _func_int *p_Var1;
  undefined8 *puVar2;
  long *plVar3;
  undefined8 *in_RDX;
  Reader params;
  StructReader local_98;
  PointerReader local_68;
  PointerReader local_40;
  
  *(int *)context.hook[1]._vptr_CallContextHook = *(int *)context.hook[1]._vptr_CallContextHook + 1;
  (**(code **)*in_RDX)(&local_40);
  local_68.pointer = local_40.pointer;
  local_68.nestingLimit = local_40.nestingLimit;
  local_68._28_4_ = local_40._28_4_;
  local_68.segment = local_40.segment;
  local_68.capTable = local_40.capTable;
  PointerReader::getStruct(&local_98,&local_68,(word *)0x0);
  if (local_98.pointerCount == 0) {
    local_98.nestingLimit = 0x7fffffff;
    local_98.pointers = (WirePointer *)0x0;
    local_98.segment = (SegmentReader *)0x0;
    local_98.capTable = (CapTableReader *)0x0;
  }
  local_68.nestingLimit = local_98.nestingLimit;
  local_68.segment = local_98.segment;
  local_68.capTable = local_98.capTable;
  local_68.pointer = local_98.pointers;
  PointerReader::getCapability(&local_40);
  p_Var1 = context.hook[3]._vptr_CallContextHook[-3];
  puVar2 = *(undefined8 **)(p_Var1 + (long)&context.hook[3]._vptr_CallContextHook);
  plVar3 = *(long **)(p_Var1 + (long)&context.hook[4]._vptr_CallContextHook);
  *(SegmentReader **)(p_Var1 + (long)&context.hook[3]._vptr_CallContextHook) = local_40.segment;
  *(CapTableReader **)(p_Var1 + (long)&context.hook[4]._vptr_CallContextHook) = local_40.capTable;
  if (plVar3 != (long *)0x0) {
    (**(code **)*puVar2)(puVar2,(long)plVar3 + *(long *)(*plVar3 + -0x10));
  }
  kj::_::readyNow();
  *(SegmentReader **)&this->super_Server = local_68.segment;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> TestMoreStuffImpl::hold(HoldContext context) {
  ++callCount;

  auto params = context.getParams();
  clientToHold = params.getCap();
  return kj::READY_NOW;
}